

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,true,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  int64_t *piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  sel_t sVar14;
  long lVar15;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar12 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar12 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = puVar2[uVar7];
      }
      uVar9 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar9 = count;
      }
      uVar11 = uVar9;
      if (uVar5 != 0) {
        uVar11 = uVar10;
        if (uVar5 == 0xffffffffffffffff) {
          if (uVar10 < uVar9) {
            psVar3 = sel->sel_vector;
            iVar1 = ldata->months;
            psVar4 = true_sel->sel_vector;
            piVar6 = &rdata[uVar10].micros;
            do {
              uVar10 = uVar11;
              if (psVar3 != (sel_t *)0x0) {
                uVar10 = (ulong)psVar3[uVar11];
              }
              if (((iVar1 != ((interval_t *)(piVar6 + -1))->months) ||
                  (ldata->days != *(int32_t *)((long)piVar6 + -4))) ||
                 (uVar5 = 1, ldata->micros != *piVar6)) {
                lVar15 = (long)ldata->days + ldata->micros / 86400000000;
                lVar8 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
                if ((long)iVar1 + lVar15 / 0x1e ==
                    (long)((interval_t *)(piVar6 + -1))->months + lVar8 / 0x1e) {
                  uVar5 = 0;
                  if (lVar15 % 0x1e == lVar8 % 0x1e) {
                    uVar5 = (ulong)(ldata->micros % 86400000000 == *piVar6 % 86400000000);
                  }
                }
                else {
                  uVar5 = 0;
                }
              }
              psVar4[iVar12] = (sel_t)uVar10;
              iVar12 = iVar12 + uVar5;
              uVar11 = uVar11 + 1;
              piVar6 = piVar6 + 2;
            } while (uVar9 != uVar11);
          }
        }
        else if (uVar10 < uVar9) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          piVar6 = &rdata[uVar10].micros;
          uVar11 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar14 = (int)uVar10 + (int)uVar11;
            }
            else {
              sVar14 = psVar3[uVar10 + uVar11];
            }
            if ((uVar5 >> (uVar11 & 0x3f) & 1) == 0) {
              uVar13 = 0;
            }
            else if (((ldata->months != ((interval_t *)(piVar6 + -1))->months) ||
                     (ldata->days != *(int32_t *)((long)piVar6 + -4))) ||
                    (uVar13 = 1, ldata->micros != *piVar6)) {
              lVar8 = (long)ldata->days + ldata->micros / 86400000000;
              lVar15 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
              if ((long)ldata->months + lVar8 / 0x1e ==
                  (long)((interval_t *)(piVar6 + -1))->months + lVar15 / 0x1e) {
                uVar13 = 0;
                if (lVar8 % 0x1e == lVar15 % 0x1e) {
                  uVar13 = (ulong)(ldata->micros % 86400000000 == *piVar6 % 86400000000);
                }
              }
              else {
                uVar13 = 0;
              }
            }
            psVar4[iVar12] = sVar14;
            iVar12 = uVar13 + iVar12;
            uVar11 = uVar11 + 1;
            piVar6 = piVar6 + 2;
          } while ((uVar10 - uVar9) + uVar11 != 0);
          uVar11 = uVar10 + uVar11;
        }
      }
      uVar7 = uVar7 + 1;
      uVar10 = uVar11;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}